

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_check_overflow(secp256k1_scalar *a)

{
  bool bVar1;
  uint uVar2;
  int no;
  int yes;
  secp256k1_scalar *a_local;
  
  bVar1 = a->d[2] < 0xfffffffffffffffe || a->d[3] != 0xffffffffffffffff;
  uVar2 = (uint)(a->d[1] < 0xbaaedce6af48a03b || bVar1);
  return (uint)(0xbfd25e8cd0364140 < a->d[0]) & (uVar2 ^ 0xffffffff) |
         (uint)(0xbaaedce6af48a03b < a->d[1]) & (uVar2 ^ 0xffffffff) |
         (uint)(a->d[2] == 0xffffffffffffffff) & (bVar1 ^ 0xffffffff);
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_check_overflow(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    no |= (a->d[3] < SECP256K1_N_3); /* No need for a > check. */
    no |= (a->d[2] < SECP256K1_N_2);
    yes |= (a->d[2] > SECP256K1_N_2) & ~no;
    no |= (a->d[1] < SECP256K1_N_1);
    yes |= (a->d[1] > SECP256K1_N_1) & ~no;
    yes |= (a->d[0] >= SECP256K1_N_0) & ~no;
    return yes;
}